

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::SystemTaskBase::SystemTaskBase
          (SystemTaskBase *this,KnownSystemName knownNameId)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,knownNameId,Task);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_00b80238;
  return;
}

Assistant:

explicit SystemTaskBase(KnownSystemName knownNameId) :
        SystemSubroutine(knownNameId, SubroutineKind::Task) {}